

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

istream * __thiscall nivalis::Plotter::import_binary_func_and_env(Plotter *this,istream *is)

{
  View *pVVar1;
  istream *in_RSI;
  istream *in_RDI;
  size_t i;
  istream *in_stack_00000028;
  Function *in_stack_00000030;
  vector<nivalis::Function,_std::allocator<nivalis::Function>_> *in_stack_ffffffffffffffd8;
  View *val;
  View *local_18;
  
  util::read_bin<unsigned_long>(in_RDI,(unsigned_long *)in_stack_ffffffffffffffd8);
  util::resize_from_read_bin<std::vector<nivalis::Function,std::allocator<nivalis::Function>>>
            (in_RDI,in_stack_ffffffffffffffd8);
  local_18 = (View *)0x0;
  while( true ) {
    val = local_18;
    pVVar1 = (View *)std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                               ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                                (in_RDI + 0x40));
    if (pVVar1 <= val) break;
    std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
              ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)(in_RDI + 0x40),
               (size_type)local_18);
    Function::from_bin(in_stack_00000030,in_stack_00000028);
    local_18 = (View *)((long)&local_18->swid + 1);
  }
  util::read_bin<nivalis::Plotter::View>(in_RDI,val);
  util::read_bin<unsigned_int>(in_RDI,(uint *)val);
  util::read_bin<unsigned_int>(in_RDI,(uint *)val);
  util::read_bin<unsigned_int>(in_RDI,(uint *)val);
  util::read_bin<unsigned_int>(in_RDI,(uint *)val);
  Environment::from_bin((Environment *)this,is);
  return in_RSI;
}

Assistant:

std::istream& Plotter::import_binary_func_and_env(std::istream& is) {
    util::read_bin(is, curr_func);
    util::resize_from_read_bin(is, funcs);
    for (size_t i = 0; i < funcs.size(); ++i) {
        funcs[i].from_bin(is);
    }
    util::read_bin(is, view);
    util::read_bin(is, x_var);
    util::read_bin(is, y_var);
    util::read_bin(is, t_var);
    util::read_bin(is, r_var);
    env.from_bin(is);
    return is;
}